

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ISingleStringReader.cpp
# Opt level: O0

void __thiscall ISingleStringReader::getWord(ISingleStringReader *this,string *str)

{
  char ch;
  bool bVar1;
  char tempChar;
  string *str_local;
  ISingleStringReader *this_local;
  
  while ((ch = std::istream::get(), ch != -1 &&
         ((bVar1 = IDictionary::isLetter(ch), bVar1 || (ch == ' '))))) {
    std::__cxx11::string::operator+=((string *)str,ch);
  }
  bVar1 = std::operator!=(str,&this->m_str);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)str,"");
  }
  return;
}

Assistant:

void ISingleStringReader::getWord(std::string &str) {
    char tempChar;

    while((tempChar = this->m_ifs->get()) != EOF)
    {
        if(IDictionary::isLetter(tempChar)||tempChar==' ')
        {
            str+=tempChar;
        }
        else
            break;
    }
    if(str!=m_str)
        str="";
}